

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer puVar1;
  _Base_ptr p_Var2;
  unsigned_long uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_02;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_02;
  bool bVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> _Var5;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined7 in_register_00000089;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  undefined8 uVar6;
  undefined7 in_stack_fffffffffffffe78;
  Flags<CommandFlavourFlagBits> FVar7;
  undefined1 in_stack_fffffffffffffe80;
  undefined1 unique;
  allocator_type local_17f;
  allocator_type local_17e;
  Flags<CommandFlavourFlagBits> local_17d;
  undefined4 local_17c;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> raiiFlags;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> flags;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  local_17c = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  determineVectorParams(&vectorParams,this,params);
  if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 2) {
    bVar4 = std::operator==(&(params->
                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                             )._M_impl.super__Vector_impl_data._M_start
                             [*(returnParams->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start].type.type,"uint32_t");
    if (bVar4) {
      bVar4 = isStructureType(this,&(params->
                                    super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(returnParams->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1]].type.type);
      if (bVar4) {
        bVar4 = isStructureChainAnchor
                          (this,&(params->
                                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(returnParams->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[1]].type.type);
        if (!bVar4) {
          bVar4 = isStructureType(this,&(params->
                                        super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [(returnParams->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start[2]].type.type);
          if (bVar4) {
            bVar4 = isStructureChainAnchor
                              (this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[2]].type.type);
            if (!bVar4) {
              p_Var2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                       _M_parent;
              _Var5 = std::
                      next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                  )vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                                 ,1);
              if (p_Var2 == _Var5._M_node[1]._M_parent) {
                puVar1 = (returnParams->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (((_Base_ptr)*puVar1 ==
                     vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent)
                   && (puVar1[1] ==
                       *(unsigned_long *)
                        (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))) {
                  uVar3 = puVar1[2];
                  _Var5 = std::
                          next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                    ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                      )vectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left,1);
                  if (uVar3 == *(unsigned_long *)(_Var5._M_node + 1)) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                               returnParams);
                    std::
                    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    ::_Rb_tree(&local_c0,&vectorParams._M_t);
                    FVar7.m_mask = '\x01';
                    unique = 0x10;
                    __l_03._M_len = 2;
                    __l_03._M_array = (iterator)&stack0xfffffffffffffe7f;
                    std::
                    vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ::vector(&flags,__l_03,&local_17f);
                    local_17d.m_mask = '\x01';
                    uVar6 = 0x13bc0d;
                    __l_04._M_len = 1;
                    __l_04._M_array = &local_17d;
                    std::
                    vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ::vector(&raiiFlags,__l_04,&local_17e);
                    returnParams_02.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)&local_c0;
                    returnParams_02.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)&local_108;
                    returnParams_02.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)&raiiFlags;
                    vectorParams_02._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
                    vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         (_Base_ptr)uVar6;
                    vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
                         in_stack_fffffffffffffe78;
                    vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
                         FVar7.m_mask;
                    generateCommandSetInclusive
                              (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                               local_17c._0_1_,returnParams_02,vectorParams_02,(bool)unique,
                               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                *)name,SUB81(initialSkipCount,0),
                               raiiFlags.
                               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_,
                               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                *)raiiFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                    std::
                    _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ::~_Vector_base(&raiiFlags.
                                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                   );
                    std::
                    _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ::~_Vector_base(&flags.
                                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                   );
                    std::
                    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    ::~_Rb_tree(&local_c0);
                    this_00 = &local_108;
                    goto LAB_0013b86c;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    bVar4 = std::operator==(&(params->
                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                             )._M_impl.super__Vector_impl_data._M_start
                             [*(returnParams->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start].type.type,"void");
    if (!bVar4) {
      bVar4 = isHandleType(this,&(params->
                                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [*(returnParams->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start].type.type);
      if (!bVar4) {
        bVar4 = std::operator==(&(params->
                                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(returnParams->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[1]].type.type,"size_t");
        if (!bVar4) {
          bVar4 = std::operator==(&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [(returnParams->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1]].type.type,
                                  "uint32_t");
          if (!bVar4) goto LAB_0013bcc6;
        }
        bVar4 = std::operator==(&(params->
                                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(returnParams->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[2]].type.type,"void");
        if (bVar4) {
LAB_0013b943:
          puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((_Base_ptr)puVar1[1] ==
               vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent) &&
             (puVar1[2] ==
              *(unsigned_long *)
               (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))) {
            raiiFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0x1001;
            __l_01._M_len = 2;
            __l_01._M_array = (iterator)&raiiFlags;
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            vector(&flags,__l_01,(allocator_type *)&stack0xfffffffffffffe7f);
            FVar7.m_mask = '\x01';
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)&stack0xfffffffffffffe7f;
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            vector(&raiiFlags,__l_02,&local_17f);
            bVar4 = isStructureChainAnchor
                              (this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(returnParams->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start].type.type);
            if (bVar4) {
              std::
              vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
              emplace_back<Flags<CommandFlavourFlagBits>>
                        ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                          *)&flags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
              std::
              vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
              emplace_back<Flags<CommandFlavourFlagBits>>
                        ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                          *)&flags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
              FVar7.m_mask = '\x02';
              std::
              vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
              emplace_back<Flags<CommandFlavourFlagBits>>
                        ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                          *)&raiiFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffe7f);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,
                       returnParams);
            uVar6 = 0x13ba20;
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::_Rb_tree(&local_60,&vectorParams._M_t);
            returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_60;
            returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)&local_f0;
            returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)&raiiFlags;
            vectorParams_01._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
            vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar6
            ;
            vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
                 in_stack_fffffffffffffe78;
            vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = FVar7.m_mask;
            generateCommandSetInclusive
                      (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_17c._0_1_
                       ,returnParams_01,vectorParams_01,(bool)in_stack_fffffffffffffe80,
                       (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        *)name,SUB81(initialSkipCount,0),
                       raiiFlags.
                       super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_,
                       (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        *)raiiFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::~_Rb_tree(&local_60);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&local_f0);
            std::
            _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ::~_Vector_base(&raiiFlags.
                             super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           );
            std::
            _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ::~_Vector_base(&flags.
                             super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           );
            goto LAB_0013bcda;
          }
        }
        else {
          bVar4 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[2]].type.type);
          if (!bVar4) {
            bVar4 = isStructureChainAnchor
                              (this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[2]].type.type);
            if (!bVar4) goto LAB_0013b943;
          }
        }
      }
    }
  }
  else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar4 = isStructureType(this,&(params->
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [*(returnParams->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start].type.type);
    if (bVar4) {
      bVar4 = isStructureChainAnchor
                        (this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start
                               [*(returnParams->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start].type.type);
      if (!bVar4) {
        bVar4 = isStructureType(this,&(params->
                                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                      )._M_impl.super__Vector_impl_data._M_start
                                      [(returnParams->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start[1]].type.type);
        if (bVar4) {
          bVar4 = isStructureChainAnchor
                            (this,&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [(returnParams->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1]].type.type);
          if (!bVar4) {
            bVar4 = std::operator==(&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[2]].type.type,
                                    "uint64_t");
            if (bVar4) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                         returnParams);
              std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::_Rb_tree(&local_90,&vectorParams._M_t);
              FVar7.m_mask = '\x01';
              __l._M_len = 1;
              __l._M_array = (iterator)&stack0xfffffffffffffe7f;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&flags,__l,&local_17f);
              local_17d.m_mask = '\x01';
              uVar6 = 0x13b802;
              __l_00._M_len = 1;
              __l_00._M_array = &local_17d;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&raiiFlags,__l_00,&local_17e);
              returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_90;
              returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&local_d8;
              returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&raiiFlags;
              vectorParams_00._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flags));
              vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)uVar6;
              vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ =
                   in_stack_fffffffffffffe78;
              vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = FVar7.m_mask;
              generateCommandSetInclusive
                        (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                         local_17c._0_1_,returnParams_00,vectorParams_00,
                         (bool)in_stack_fffffffffffffe80,
                         (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          *)name,SUB81(initialSkipCount,0),
                         raiiFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_,
                         (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          *)raiiFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              std::
              _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~_Vector_base(&raiiFlags.
                               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             );
              std::
              _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~_Vector_base(&flags.
                               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             );
              std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::~_Rb_tree(&local_90);
              this_00 = &local_d8;
LAB_0013b86c:
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (this_00);
              goto LAB_0013bcda;
            }
          }
        }
      }
    }
  }
LAB_0013bcc6:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&flags);
LAB_0013bcda:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return( std::string const &         name,
                                                                                    CommandData const &         commandData,
                                                                                    size_t                      initialSkipCount,
                                                                                    bool                        definition,
                                                                                    std::vector<size_t> const & returnParams,
                                                                                    bool                        raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  switch ( vectorParams.size() )
  {
    case 0:
      if ( isStructureType( commandData.params[returnParams[0]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( commandData.params[returnParams[2]].type.type == "uint64_t" )
          {
            return generateCommandSetInclusive( name,
                                                commandData,
                                                initialSkipCount,
                                                definition,
                                                returnParams,
                                                vectorParams,
                                                false,
                                                { CommandFlavourFlagBits::enhanced },
                                                raii,
                                                false,
                                                { CommandFlavourFlagBits::enhanced } );
          }
        }
      }
      break;
    case 1:
      if ( ( commandData.params[returnParams[0]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[0]].type.type ) )
      {
        if ( ( commandData.params[returnParams[1]].type.type == "size_t" ) || ( commandData.params[returnParams[1]].type.type == "uint32_t" ) )
        {
          if ( ( commandData.params[returnParams[2]].type.type == "void" ) ||
               ( !isHandleType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) ) )
          {
            if ( returnParams[1] == vectorParams.begin()->second.lenParam )
            {
              if ( returnParams[2] == vectorParams.begin()->first )
              {
                std::vector<CommandFlavourFlags> flags     = { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator };
                std::vector<CommandFlavourFlags> raiiFlags = { CommandFlavourFlagBits::enhanced };
                if ( isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
                {
                  flags.push_back( CommandFlavourFlagBits::chained );
                  flags.push_back( CommandFlavourFlagBits::chained | CommandFlavourFlagBits::withAllocator );
                  raiiFlags.push_back( CommandFlavourFlagBits::chained );
                }
                return generateCommandSetInclusive(
                  name, commandData, initialSkipCount, definition, returnParams, vectorParams, false, flags, raii, false, raiiFlags );
              }
            }
          }
        }
      }
      break;
    case 2:
      if ( commandData.params[returnParams[0]].type.type == "uint32_t" )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( isStructureType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) )
          {
            if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
            {
              if ( returnParams[0] == vectorParams.begin()->second.lenParam )
              {
                if ( returnParams[1] == vectorParams.begin()->first )
                {
                  if ( returnParams[2] == std::next( vectorParams.begin() )->first )
                  {
                    return generateCommandSetInclusive( name,
                                                        commandData,
                                                        initialSkipCount,
                                                        definition,
                                                        returnParams,
                                                        vectorParams,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                                        raii,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced } );
                  }
                }
              }
            }
          }
        }
      }
      break;
  }
  return "";
}